

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kvtree.c
# Opt level: O0

int kvtree_elem_log(kvtree_elem *elem,int log_level,int indent)

{
  int local_41c;
  undefined1 local_418 [4];
  int i;
  char tmp [1024];
  int indent_local;
  int log_level_local;
  kvtree_elem *elem_local;
  
  tmp._1016_4_ = indent;
  tmp._1020_4_ = log_level;
  for (local_41c = 0; local_41c < (int)tmp._1016_4_; local_41c = local_41c + 1) {
    local_418[local_41c] = 0x20;
  }
  local_418[(int)tmp._1016_4_] = 0;
  if (elem == (kvtree_elem *)0x0) {
    kvtree_dbg(tmp._1020_4_,"%sNULL ELEMENT\n",local_418);
  }
  else {
    if (elem->key == (char *)0x0) {
      kvtree_dbg(tmp._1020_4_,"%sNULL KEY\n",local_418);
    }
    else {
      kvtree_dbg(tmp._1020_4_,"%s%s\n",local_418,elem->key);
    }
    kvtree_log(elem->hash,tmp._1020_4_,tmp._1016_4_);
  }
  return 0;
}

Assistant:

static int kvtree_elem_log(const kvtree_elem* elem, int log_level, int indent)
{
  char tmp[KVTREE_MAX_FILENAME];
  int i;
  for (i = 0; i < indent; i++) {
    tmp[i] = ' ';
  }
  tmp[indent] = '\0';

  if (elem != NULL) {
    if (elem->key != NULL) {
      kvtree_dbg(log_level, "%s%s\n", tmp, elem->key);
    } else {
      kvtree_dbg(log_level, "%sNULL KEY\n", tmp);
    }
    kvtree_log(elem->hash, log_level, indent);
  } else {
    kvtree_dbg(log_level, "%sNULL ELEMENT\n", tmp);
  }
  return KVTREE_SUCCESS;
}